

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmAssignment(LlvmCompilationContext *ctx,ExprAssignment *node)

{
  TypeBase *valueType;
  LLVMValueRef pLVar1;
  TypeBase *valueType_00;
  
  CompileLlvm(ctx,node->lhs);
  pLVar1 = CompileLlvm(ctx,node->rhs);
  valueType = node->rhs->type;
  valueType_00 = GetStackType(ctx,valueType);
  ConvertToDataType(ctx,pLVar1,valueType_00,valueType);
  pLVar1 = CheckType(ctx,&node->super_ExprBase,pLVar1);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmAssignment(LlvmCompilationContext &ctx, ExprAssignment *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->lhs);

	LLVMValueRef initializer = CompileLlvm(ctx, node->rhs);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, initializer, GetStackType(ctx, node->rhs->type), node->rhs->type), address);

	return CheckType(ctx, node, initializer);
}